

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O0

ssize_t __thiscall amrex::FABio_ascii::read(FABio_ascii *this,int __fd,void *__buf,size_t __nbytes)

{
  double *pdVar1;
  BaseFab<double> *pBVar2;
  void *this_00;
  int iVar3;
  int iVar4;
  IntVect *pIVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  Long LVar9;
  ulong uVar10;
  ulong extraout_RAX;
  Box *this_01;
  undefined4 in_register_00000034;
  bool bVar11;
  int k;
  IntVect q;
  IntVect p;
  IntVect bg;
  IntVect sm;
  Box *bx;
  Long result;
  ostream *in_stack_fffffffffffffd28;
  Box *in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  int local_264;
  IntVect local_260;
  IntVect local_254;
  undefined8 local_248;
  int local_240;
  int local_23c [2];
  int local_234;
  Box *local_230;
  BaseFab<double> *local_228;
  void *local_220;
  FABio_ascii *local_218;
  char *local_210;
  char *local_208;
  undefined8 *local_200;
  IntVect *local_1f8;
  IntVect *local_1f0;
  Box *local_1e8;
  IntVect *local_1e0;
  IntVect *local_1d8;
  int local_1cc;
  IntVect *local_1c8;
  BaseFab<double> *local_1c0;
  undefined4 local_1b4;
  IntVect *local_1b0;
  undefined4 local_1a4;
  IntVect *local_1a0;
  undefined4 local_194;
  IntVect *local_190;
  undefined4 local_184;
  Box *local_180;
  undefined4 local_174;
  IntVect *local_170;
  undefined4 local_164;
  Box *local_160;
  undefined4 local_154;
  IntVect *local_150;
  IntVect *local_148;
  undefined8 *local_140;
  undefined4 local_134;
  IntVect *local_130;
  undefined4 local_124;
  IntVect *local_120;
  undefined4 local_114;
  IntVect *local_110;
  undefined4 local_104;
  IntVect *local_100;
  undefined4 local_f4;
  IntVect *local_f0;
  undefined4 local_e4;
  IntVect *local_e0;
  undefined4 local_d4;
  IntVect *local_d0;
  undefined4 local_c4;
  IntVect *local_c0;
  undefined4 local_b4;
  IntVect *local_b0;
  undefined4 local_a4;
  IntVect *local_a0;
  undefined4 local_94;
  IntVect *local_90;
  undefined4 local_84;
  IntVect *local_80;
  long local_78;
  IntVect *local_70;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  undefined4 local_3c;
  Box *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  Box *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_220 = (void *)CONCAT44(in_register_00000034,__fd);
  local_228 = (BaseFab<double> *)__buf;
  local_218 = this;
  local_230 = BaseFab<double>::box((BaseFab<double> *)__buf);
  pIVar5 = Box::smallEnd(local_230);
  local_23c = *(int (*) [2])pIVar5->vect;
  local_234 = pIVar5->vect[2];
  pIVar5 = Box::bigEnd(local_230);
  local_248 = *(undefined8 *)pIVar5->vect;
  local_240 = pIVar5->vect[2];
  IntVect::IntVect(&local_254);
  IntVect::IntVect(&local_260);
  local_254.vect[0] = local_23c[0];
  local_254.vect[1] = local_23c[1];
  local_254.vect[2] = local_234;
  while( true ) {
    local_1f8 = &local_254;
    local_200 = &local_248;
    local_f4 = 2;
    bVar11 = true;
    if (local_254.vect[2] <= local_240) {
      local_104 = 2;
      bVar11 = false;
      local_100 = local_1f8;
      if (local_240 == local_254.vect[2]) {
        local_114 = 1;
        bVar11 = true;
        local_110 = local_1f8;
        if (local_254.vect[1] <= local_248._4_4_) {
          local_124 = 1;
          bVar11 = false;
          local_120 = local_1f8;
          if (local_248._4_4_ == local_254.vect[1]) {
            local_134 = 0;
            bVar11 = (int)local_248 < local_254.vect[0];
            local_130 = local_1f8;
          }
        }
      }
    }
    local_148 = local_1f8;
    local_140 = local_200;
    local_f0 = local_1f8;
    if (bVar11) break;
    amrex::operator>>((istream *)in_stack_fffffffffffffd30,(IntVect *)in_stack_fffffffffffffd28);
    local_1d8 = &local_254;
    local_1e0 = &local_260;
    local_194 = 0;
    bVar11 = true;
    if (local_254.vect[0] == local_260.vect[0]) {
      local_1a4 = 1;
      bVar11 = true;
      local_1a0 = local_1e0;
      if (local_254.vect[1] == local_260.vect[1]) {
        local_1b4 = 2;
        bVar11 = local_254.vect[2] != local_260.vect[2];
        local_1b0 = local_1e0;
      }
    }
    local_190 = local_1e0;
    if (bVar11) {
      poVar6 = ErrorStream();
      std::operator<<(poVar6,"Error: read IntVect ");
      poVar6 = amrex::operator<<(in_stack_fffffffffffffd28,(IntVect *)0x127b776);
      std::operator<<(poVar6,"  should be ");
      poVar6 = amrex::operator<<(in_stack_fffffffffffffd28,(IntVect *)0x127b795);
      std::operator<<(poVar6,'\n');
      local_208 = "FABio_ascii::read() bad IntVect";
      Error_host((char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    }
    local_264 = 0;
    while( true ) {
      iVar3 = BaseFab<double>::nComp(local_228);
      this_00 = local_220;
      pBVar2 = local_228;
      if (iVar3 <= local_264) break;
      local_1c0 = local_228;
      local_1c8 = &local_254;
      local_1cc = local_264;
      pdVar1 = local_228->dptr;
      this_01 = &local_228->domain;
      local_c = 0;
      local_1c = 0;
      local_78 = (long)(local_254.vect[0] - (this_01->smallend).vect[0]);
      local_70 = local_1c8;
      local_68 = this_01;
      local_18 = this_01;
      local_8 = local_1c8;
      iVar3 = Box::length(this_01,0);
      local_28 = local_70;
      local_2c = 1;
      local_3c = 1;
      in_stack_fffffffffffffd44 = local_70->vect[1] - (pBVar2->domain).smallend.vect[1];
      local_48 = local_70;
      local_4c = 2;
      local_5c = 2;
      in_stack_fffffffffffffd40 = local_70->vect[2] - (pBVar2->domain).smallend.vect[2];
      local_58 = this_01;
      local_38 = this_01;
      iVar4 = Box::length(this_01,1);
      lVar7 = iVar3 * (in_stack_fffffffffffffd44 + in_stack_fffffffffffffd40 * iVar4) + local_78;
      lVar8 = (long)local_1cc;
      local_78 = lVar7;
      LVar9 = Box::numPts((Box *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
      std::istream::operator>>(this_00,pdVar1 + lVar7 + lVar8 * LVar9);
      local_264 = local_264 + 1;
    }
    local_1e8 = local_230;
    local_1f0 = &local_254;
    local_84 = 0;
    local_94 = 0;
    local_150 = &local_230->bigend;
    local_154 = 0;
    in_stack_fffffffffffffd30 = local_230;
    local_90 = local_1f0;
    local_80 = local_1f0;
    if (local_150->vect[0] < local_254.vect[0] + 1) {
      local_160 = local_230;
      local_164 = 0;
      local_a4 = 0;
      local_b4 = 1;
      local_c4 = 1;
      local_170 = &local_230->bigend;
      local_174 = 1;
      local_c0 = local_1f0;
      local_b0 = local_1f0;
      local_a0 = local_1f0;
      if ((local_230->bigend).vect[1] < local_254.vect[1] + 1) {
        local_180 = local_230;
        local_184 = 1;
        local_d4 = 1;
        local_e4 = 2;
        local_e0 = local_1f0;
        local_d0 = local_1f0;
      }
    }
  }
  uVar10 = std::ios::fail();
  if ((uVar10 & 1) != 0) {
    local_210 = "FABio_ascii::read() failed";
    Error_host((char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    uVar10 = extraout_RAX;
  }
  return uVar10;
}

Assistant:

void
FABio_ascii::read (std::istream& is,
                   FArrayBox&    f) const
{
    const Box& bx = f.box();

    IntVect sm = bx.smallEnd();
    IntVect bg = bx.bigEnd();
    IntVect p, q;
    for(p = sm; p <= bg; bx.next(p)) {
        is >> q;
        if(p != q) {
          amrex::ErrorStream() << "Error: read IntVect "
                    << q
                    << "  should be "
                    << p
                    << '\n';
          amrex::Error("FABio_ascii::read() bad IntVect");
        }
        for(int k(0); k < f.nComp(); ++k) {
            is >> f(p, k);
        }
    }

    if(is.fail()) {
        amrex::Error("FABio_ascii::read() failed");
    }
}